

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O2

void ReadUserInfo(FSerializer *arc,userinfo_t *info,FString *skin)

{
  bool bVar1;
  int team;
  char *text;
  FBaseCVar **ppFVar2;
  FName name;
  FName local_44;
  FString *local_40;
  char *str;
  
  name.Index = 0;
  userinfo_t::Reset(info);
  local_40 = skin;
  FString::operator=(skin,(char *)0x0);
  bVar1 = FSerializer::BeginObject(arc,"userinfo");
  if (bVar1) {
    while( true ) {
      text = FSerializer::GetKey(arc);
      if (text == (char *)0x0) break;
      FSerializer::StringPtr(arc,(char *)0x0,&str);
      FName::operator=(&name,text);
      local_44.Index = name.Index;
      ppFVar2 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::CheckKey
                          (&info->
                            super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                           ,&local_44);
      if ((ppFVar2 != (FBaseCVar **)0x0) && (*ppFVar2 != (FBaseCVar *)0x0)) {
        if (name.Index == 0x23c) {
          userinfo_t::PlayerClassChanged(info,str);
        }
        else if (name.Index == 0x208) {
          FString::operator=(local_40,str);
        }
        else if (name.Index == 0x203) {
          team = atoi(str);
          userinfo_t::TeamChanged(info,team);
        }
        else {
          FBaseCVar::SetGenericRep(*ppFVar2,(UCVarValue)str,CVAR_String);
        }
      }
    }
    FSerializer::EndObject(arc);
  }
  return;
}

Assistant:

void ReadUserInfo(FSerializer &arc, userinfo_t &info, FString &skin)
{
	FName name;
	FBaseCVar **cvar;
	UCVarValue val;
	const char *key;
	const char *str;

	info.Reset();
	skin = NULL;
	if (arc.BeginObject("userinfo"))
	{
		while ((key = arc.GetKey()))
		{
			arc.StringPtr(nullptr, str);
			name = key;
			cvar = info.CheckKey(name);
			if (cvar != NULL && *cvar != NULL)
			{
				switch (name)
				{
				case NAME_Team:			info.TeamChanged(atoi(str)); break;
				case NAME_Skin:			skin = str; break;	// Caller must call SkinChanged() once current calss is known
				case NAME_PlayerClass:	info.PlayerClassChanged(str); break;
				default:
					val.String = str;
					(*cvar)->SetGenericRep(val, CVAR_String);
					break;
				}
			}
		}
		arc.EndObject();
	}
}